

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testVec.cpp
# Opt level: O0

void anon_unknown.dwarf_97a80::testLength4T<float>(void)

{
  bool bVar1;
  float fVar2;
  double dVar3;
  undefined1 auVar4 [16];
  float t;
  Vec4<float> v;
  float e;
  float s;
  float in_stack_fffffffffffffd5c;
  float in_stack_fffffffffffffd60;
  float in_stack_fffffffffffffd64;
  Vec4<float> *in_stack_fffffffffffffd68;
  Vec4<float> *in_stack_fffffffffffffd78;
  Vec4<float> local_26c [2];
  Vec4<float> local_24c [2];
  Vec4<float> local_22c [2];
  Vec4<float> local_20c [2];
  Vec4<float> local_1ec [2];
  Vec4<float> local_1cc [2];
  Vec4<float> local_1ac [2];
  Vec4<float> local_18c [2];
  Vec4<float> local_16c [2];
  Vec4<float> local_14c [2];
  Vec4<float> local_12c [2];
  Vec4<float> local_10c [2];
  Vec4<float> local_ec [2];
  Vec4<float> local_cc;
  float local_bc;
  Vec4<float> local_a8 [2];
  Vec4<float> local_88 [2];
  Vec4<float> local_68 [2];
  Vec4<float> local_48 [2];
  Vec4<float> local_28;
  Vec4<float> local_18;
  float local_8;
  float local_4;
  undefined1 extraout_var [12];
  
  auVar4._0_4_ = Imath_2_5::limits<float>::smallest();
  auVar4._4_12_ = extraout_var;
  dVar3 = Imath_2_5::Math<float>::sqrt(auVar4._0_8_);
  local_4 = SUB84(dVar3,0);
  local_8 = Imath_2_5::limits<float>::epsilon();
  local_8 = local_8 * 4.0;
  Imath_2_5::Vec4<float>::Vec4(&local_18);
  Imath_2_5::Vec4<float>::Vec4(&local_28,0.0,0.0,0.0,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,&local_28);
  fVar2 = Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    __assert_fail("v.length() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xc6,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  fVar2 = Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    __assert_fail("v.normalized().length() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,199,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_48,3.0,4.0,0.0,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_48);
  fVar2 = Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  if ((fVar2 != 5.0) || (NAN(fVar2))) {
    __assert_fail("v.length() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xca,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xcb,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_68,3000.0,4000.0,0.0,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_68);
  fVar2 = Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  if ((fVar2 != 5000.0) || (NAN(fVar2))) {
    __assert_fail("v.length() == 5000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xce,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xcf,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_88,1.0,-1.0,1.0,1.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_88);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), 2, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xd2,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xd3,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_a8,1000.0,-1000.0,1000.0,1000.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_a8);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), 2000, 1000 * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xd6,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xd7,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  local_bc = local_4 * 16.0;
  Imath_2_5::Vec4<float>::Vec4(&local_cc,local_bc,0.0,0.0,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,&local_cc);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xdc,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xdd,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_ec,0.0,local_bc,0.0,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_ec);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xdf,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe0,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_10c,0.0,0.0,local_bc,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_10c);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe2,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe3,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_12c,0.0,0.0,0.0,local_bc);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_12c);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe5,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe6,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_14c,-local_bc,-local_bc,-local_bc,-local_bc);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_14c);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe8,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe9,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  local_bc = local_4 / 16.0;
  Imath_2_5::Vec4<float>::Vec4(local_16c,local_bc,0.0,0.0,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_16c);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xee,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xef,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_18c,0.0,local_bc,0.0,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_18c);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf1,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf2,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_1ac,0.0,0.0,local_bc,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_1ac);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf4,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf5,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_1cc,0.0,0.0,0.0,local_bc);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_1cc);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf7,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf8,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_1ec,-local_bc,-local_bc,-local_bc,-local_bc);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_1ec);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xfa,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xfb,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  local_bc = local_4 / 1048576.0;
  Imath_2_5::Vec4<float>::Vec4(local_20c,local_bc,0.0,0.0,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_20c);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x100,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x101,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_22c,0.0,local_bc,0.0,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_22c);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x103,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x104,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_24c,0.0,0.0,local_bc,0.0);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_24c);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x106,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x107,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4(local_26c,0.0,0.0,0.0,local_bc);
  Imath_2_5::Vec4<float>::operator=(&local_18,local_26c);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x109,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x10a,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::Vec4
            ((Vec4<float> *)&stack0xfffffffffffffd74,-local_bc,-local_bc,-local_bc,-local_bc);
  Imath_2_5::Vec4<float>::operator=(&local_18,(Vec4<float> *)&stack0xfffffffffffffd74);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x10c,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  Imath_2_5::Vec4<float>::normalized(in_stack_fffffffffffffd78);
  Imath_2_5::Vec4<float>::length(in_stack_fffffffffffffd68);
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_fffffffffffffd64,(int)in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd5c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x10d,"void (anonymous namespace)::testLength4T() [T = float]");
  }
  return;
}

Assistant:

void
testLength4T ()
{
    const T s = Math<T>::sqrt (limits<T>::smallest());
    const T e = 4 * limits<T>::epsilon();

    Vec4<T> v;

    v = Vec4<T> (0, 0, 0, 0);
    assert (v.length() == 0);
    assert (v.normalized().length() == 0);

    v = Vec4<T> (3, 4, 0, 0);
    assert (v.length() == 5);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec4<T> (3000, 4000, 0, 0);
    assert (v.length() == 5000);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec4<T> (1, -1, 1, 1);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), 2, e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec4<T> (1000, -1000, 1000, 1000);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), 2000, 1000 * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    T t = s * (1 << 4);

    v = Vec4<T> (t, 0, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (-t, -t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    t = s / (1 << 4);

    v = Vec4<T> (t, 0, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (-t, -t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    t = s / (1 << 20);

    v = Vec4<T> (t, 0, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (-t, -t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
}